

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O0

int __thiscall
CVmObjByteArray::getp_digestMD5(CVmObjByteArray *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  int iVar2;
  vm_obj_id_t obj;
  uint *in_RCX;
  vm_val_t *in_RDX;
  md5_state_t *in_RDI;
  int i;
  char *bufp;
  char buf [32];
  uchar hash [16];
  int HASH_BYTES;
  size_t cur;
  uchar *p;
  size_t avail;
  md5_state_t ctx;
  long len;
  long idx;
  long cnt;
  uint argc;
  undefined7 in_stack_fffffffffffffeb8;
  uchar in_stack_fffffffffffffebf;
  uint *in_stack_fffffffffffffec0;
  md5_state_t *in_stack_fffffffffffffec8;
  md5_state_t *pmVar3;
  md5_state_t *pms;
  uint uVar4;
  int local_114;
  md5_state_t *local_b8;
  md5_state_t local_b0;
  md5_state_t *local_58;
  byte *local_50;
  md5_state_t *local_48;
  uint local_2c;
  vm_val_t *local_20;
  
  if (in_RCX == (uint *)0x0) {
    uVar4 = 0;
  }
  else {
    uVar4 = *in_RCX;
  }
  local_2c = uVar4;
  local_20 = in_RDX;
  if ((getp_digestMD5(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_digestMD5(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_digestMD5::desc,0,2);
    __cxa_guard_release(&getp_digestMD5(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                     (CVmNativeCodeDesc *)
                     CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
  if (iVar1 == 0) {
    local_48 = (md5_state_t *)get_element_count((CVmObjByteArray *)0x2c47dc);
    if (local_2c == 0) {
      iVar1 = 1;
    }
    else {
      iVar1 = CVmBif::pop_int_val();
    }
    local_50 = (byte *)(long)iVar1;
    pms = local_48;
    if (1 < local_2c) {
      iVar2 = CVmBif::pop_int_val();
      pms = (md5_state_t *)(long)iVar2;
    }
    if ((long)local_50 < 1) {
      local_50 = (byte *)0x1;
    }
    else if ((long)((long)local_48->count + 1) < (long)local_50) {
      local_50 = (byte *)((long)local_48->count + 1);
    }
    if ((long)pms < 0) {
      local_58 = (md5_state_t *)0x0;
    }
    else {
      local_58 = pms;
      if ((long)local_48 + (1 - (long)local_50) < (long)pms) {
        local_58 = (md5_state_t *)((long)local_48 + (1 - (long)local_50));
      }
    }
    md5_init(&local_b0);
    for (; 0 < (long)local_58; local_58 = (md5_state_t *)((long)local_58 - (long)pmVar3)) {
      get_ele_ptr((CVmObjByteArray *)in_RDI,CONCAT44(uVar4,iVar1),(size_t *)pms);
      pmVar3 = local_b8;
      if ((long)local_58 < (long)local_b8) {
        pmVar3 = local_58;
      }
      in_stack_fffffffffffffec8 = pmVar3;
      md5_append(in_RDI,(md5_byte_t *)CONCAT44(uVar4,iVar1),(int)((ulong)pms >> 0x20));
    }
    md5_finish(pms,(md5_byte_t *)in_stack_fffffffffffffec8);
    for (local_114 = 0; local_114 < 0x10; local_114 = local_114 + 1) {
      byte_to_xdigits((char *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebf);
    }
    obj = CVmObjString::create
                    ((int)((ulong)pms >> 0x20),(char *)in_stack_fffffffffffffec8,(size_t)local_20);
    vm_val_t::set_obj(local_20,obj);
  }
  return 1;
}

Assistant:

int CVmObjByteArray::getp_digestMD5(
    VMG_ vm_obj_id_t self, vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = oargc != 0 ? *oargc : 0;
    static CVmNativeCodeDesc desc(0, 2);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the starting index and length */
    long cnt = get_element_count();
    long idx = argc >= 1 ? CVmBif::pop_int_val(vmg0_) : 1;
    long len = argc >= 2 ? CVmBif::pop_int_val(vmg0_) : cnt;

    /* limit the starting index to the available range */
    if (idx < 1)
        idx = 1;
    else if (idx > cnt + 1)
        idx = cnt + 1;

    /* limit the length to the range remaining */
    if (len < 0)
        len = 0;
    else if (len > cnt - idx + 1)
        len = cnt - idx + 1;

    /* set up the hash accumulator */
    md5_state_t ctx;
    md5_init(&ctx);

    /* feed the selected range of bytes into the hash */
    while (len > 0)
    {
        /* get the next chunk */
        size_t avail;
        unsigned char *p = get_ele_ptr(idx, &avail);

        /* use the whole chunk, up to the amount remaining in the request */
        size_t cur = (len < (long)avail ? (size_t)len : avail);

        /* feed this chunk into the hash */
        md5_append(&ctx, p, cur);

        /* deduct this chunk from the remaining length */
        len -= cur;
    }

    /* calculate the hash result */
    const int HASH_BYTES = 16;
    unsigned char hash[HASH_BYTES];
    md5_finish(&ctx, hash);

    /* convert the binary hash to printable hex digits */
    char buf[HASH_BYTES*2], *bufp = buf;
    for (int i = 0 ; i < HASH_BYTES ; ++i, bufp += 2)
        byte_to_xdigits(bufp, hash[i]);

    /* return the string */
    retval->set_obj(CVmObjString::create(vmg_ FALSE, buf, HASH_BYTES*2));

    /* handled */
    return TRUE;
}